

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  long lVar2;
  short sVar3;
  short sVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uchar *st_00;
  long *in_RSI;
  long *in_RDI;
  int m1;
  int p1;
  int kex;
  int k;
  int tbl;
  uchar *st;
  JCOEFPTR thiscoef;
  JBLOCKROW block;
  arith_entropy_ptr_conflict entropy;
  int local_44;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar9;
  j_decompress_ptr in_stack_ffffffffffffffd0;
  
  lVar1 = in_RDI[0x4a];
  if ((int)in_RDI[0x2e] != 0) {
    if (*(int *)(lVar1 + 0x4c) == 0) {
      process_restart((j_decompress_ptr)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    *(int *)(lVar1 + 0x4c) = *(int *)(lVar1 + 0x4c) + -1;
  }
  if (*(int *)(lVar1 + 0x28) != -1) {
    lVar2 = *in_RSI;
    iVar9 = *(int *)(in_RDI[0x37] + 0x18);
    lVar5 = in_RDI[0x43];
    lVar6 = in_RDI[0x43];
    local_44 = (int)in_RDI[0x42];
    while ((0 < local_44 && (*(short *)(lVar2 + (long)jpeg_natural_order[local_44] * 2) == 0))) {
      local_44 = local_44 + -1;
    }
    iVar8 = *(int *)((long)in_RDI + 0x20c);
    while ((iVar8 <= (int)in_RDI[0x42] &&
           ((st_00 = (uchar *)(*(long *)(lVar1 + 0xd0 + (long)iVar9 * 8) + (long)((iVar8 + -1) * 3))
            , iVar8 <= local_44 ||
            (iVar7 = arith_decode(in_stack_ffffffffffffffd0,st_00), iVar7 == 0))))) {
      while( true ) {
        in_stack_ffffffffffffffd0 = (j_decompress_ptr)(lVar2 + (long)jpeg_natural_order[iVar8] * 2);
        sVar3 = (short)(-1 << ((byte)(int)lVar6 & 0x1f));
        sVar4 = (short)(1 << ((byte)(int)lVar5 & 0x1f));
        if (*(short *)&in_stack_ffffffffffffffd0->err != 0) break;
        iVar7 = arith_decode(in_stack_ffffffffffffffd0,st_00);
        if (iVar7 != 0) {
          iVar7 = arith_decode(in_stack_ffffffffffffffd0,st_00);
          if (iVar7 == 0) {
            *(short *)&in_stack_ffffffffffffffd0->err = sVar4;
          }
          else {
            *(short *)&in_stack_ffffffffffffffd0->err = sVar3;
          }
          goto LAB_00150645;
        }
        st_00 = st_00 + 3;
        iVar8 = iVar8 + 1;
        if ((int)in_RDI[0x42] < iVar8) {
          *(undefined4 *)(*in_RDI + 0x28) = 0x7e;
          (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
          *(undefined4 *)(lVar1 + 0x28) = 0xffffffff;
          return 1;
        }
      }
      iVar7 = arith_decode(in_stack_ffffffffffffffd0,st_00);
      if (iVar7 != 0) {
        if (*(short *)&in_stack_ffffffffffffffd0->err < 0) {
          *(short *)&in_stack_ffffffffffffffd0->err =
               *(short *)&in_stack_ffffffffffffffd0->err + sVar3;
        }
        else {
          *(short *)&in_stack_ffffffffffffffd0->err =
               *(short *)&in_stack_ffffffffffffffd0->err + sVar4;
        }
      }
LAB_00150645:
      iVar8 = iVar8 + 1;
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  unsigned char *st;
  int tbl, k, kex;
  int p1, m1;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  p1 = 1 << cinfo->Al;          /* 1 in the bit position being coded */
  m1 = (NEG_1) << cinfo->Al;    /* -1 in the bit position being coded */

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = cinfo->Se; kex > 0; kex--)
    if ((*block)[jpeg_natural_order[kex]]) break;

  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      if (arith_decode(cinfo, st)) break;       /* EOB flag */
    for (;;) {
      thiscoef = *block + jpeg_natural_order[k];
      if (*thiscoef) {                          /* previously nonzero coef */
        if (arith_decode(cinfo, st + 2)) {
          if (*thiscoef < 0)
            *thiscoef += m1;
          else
            *thiscoef += p1;
        }
        break;
      }
      if (arith_decode(cinfo, st + 1)) {        /* newly nonzero coef */
        if (arith_decode(cinfo, entropy->fixed_bin))
          *thiscoef = m1;
        else
          *thiscoef = p1;
        break;
      }
      st += 3;  k++;
      if (k > cinfo->Se) {
        WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
        entropy->ct = -1;                       /* spectral overflow */
        return TRUE;
      }
    }
  }

  return TRUE;
}